

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_reliability(REF_GEOM ref_geom,REF_INT geom,REF_DBL *slop)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  double dVar4;
  REF_DBL gap;
  REF_DBL tol;
  double local_30;
  double local_28;
  
  *slop = 0.0;
  uVar1 = ref_egads_tolerance(ref_geom,ref_geom->descr[geom * 6],ref_geom->descr[geom * 6 + 1],
                              &local_28);
  if (uVar1 == 0) {
    local_28 = ref_geom->tolerance_protection * local_28;
    dVar4 = *slop;
    if (*slop <= local_28) {
      dVar4 = local_28;
    }
    *slop = dVar4;
    uVar1 = ref_egads_gap(ref_geom,ref_geom->descr[(long)(geom * 6) + 5],&local_30);
    if (uVar1 == 0) {
      local_30 = ref_geom->gap_protection * local_30;
      dVar4 = *slop;
      if (*slop <= local_30) {
        dVar4 = local_30;
      }
      *slop = dVar4;
      return 0;
    }
    pcVar3 = "gap";
    uVar2 = 0xa40;
  }
  else {
    pcVar3 = "tol";
    uVar2 = 0xa36;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar2,
         "ref_geom_reliability",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_reliability(REF_GEOM ref_geom, REF_INT geom,
                                        REF_DBL *slop) {
  REF_DBL tol, gap;
  *slop = 0.0;
  RSS(ref_egads_tolerance(ref_geom, ref_geom_type(ref_geom, geom),
                          ref_geom_id(ref_geom, geom), &tol),
      "tol");
  *slop = MAX(*slop, ref_geom_tolerance_protection(ref_geom) * tol);
  /*
    each_ref_geom_having_node(ref_geom, node, item, geom) {
      RSS(ref_geom_tolerance(ref_geom, ref_geom_type(ref_geom, geom),
                             ref_geom_id(ref_geom, geom), &tol),
          "tol");
      *slop = MAX(*slop, ref_geom_tolerance_protection(ref_geom) * tol);
    }
  */
  RSS(ref_egads_gap(ref_geom, ref_geom_node(ref_geom, geom), &gap), "gap");
  *slop = MAX(*slop, ref_geom_gap_protection(ref_geom) * gap);
  return REF_SUCCESS;
}